

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O1

void __thiscall
QGraphicsDropShadowEffect::setOffset(QGraphicsDropShadowEffect *this,QPointF *offset)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QPointF QVar3;
  QPointF local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  QVar3 = QPixmapDropShadowFilter::offset(*(QPixmapDropShadowFilter **)(lVar1 + 0xa8));
  local_38.yp = QVar3.yp;
  local_38.xp = QVar3.xp;
  bVar2 = qFuzzyCompare(&local_38,offset);
  if (!bVar2) {
    QPixmapDropShadowFilter::setOffset(*(QPixmapDropShadowFilter **)(lVar1 + 0xa8),offset);
    QGraphicsEffect::updateBoundingRect(&this->super_QGraphicsEffect);
    local_38.xp = 0.0;
    local_38.yp = (qreal)offset;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsDropShadowEffect::setOffset(const QPointF &offset)
{
    Q_D(QGraphicsDropShadowEffect);
    if (d->filter->offset() == offset)
        return;

    d->filter->setOffset(offset);
    updateBoundingRect();
    emit offsetChanged(offset);
}